

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::vector<double,_std::allocator<double>_>_>::internalSetData<unsigned_long>
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,unsigned_long data)

{
  bool bVar1;
  unsigned_long in_RSI;
  long in_RDI;
  bool result;
  vector<double,_std::allocator<double>_> tmp;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  RepType local_28;
  unsigned_long local_10;
  
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2c83f8);
  bVar1 = ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert<unsigned_long>
                    (local_10,&local_28);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)this,
               (vector<double,_std::allocator<double>_> *)data);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffffc4,uVar2));
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }